

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.c
# Opt level: O0

_Bool eckey_from_cbor(eckey_t *eckey,cn_cbor *pKey,cose_errback *perr)

{
  uint8_t *puVar1;
  int iVar2;
  cn_cbor *pcVar3;
  mbedtls_ecp_group_id local_8c;
  mbedtls_ecp_group_id groupId;
  cn_cbor *p;
  int cbGroup;
  int cbKey;
  byte rgbKey [65];
  cose_errback *perr_local;
  cn_cbor *pKey_local;
  eckey_t *eckey_local;
  
  mbedtls_ecp_keypair_init(eckey);
  pcVar3 = cn_cbor_mapget_int(pKey,1);
  if (pcVar3 == (cn_cbor *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (pcVar3->type == CN_CBOR_UINT) {
    if ((pcVar3->v).bytes == (uint8_t *)0x2) {
      pcVar3 = cn_cbor_mapget_int(pKey,-1);
      if ((pcVar3 == (cn_cbor *)0x0) || (pcVar3->type != CN_CBOR_UINT)) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
      }
      else {
        puVar1 = (pcVar3->v).bytes;
        if (puVar1 == (uint8_t *)0x1) {
          local_8c = MBEDTLS_ECP_DP_SECP256R1;
        }
        else if (puVar1 == (uint8_t *)0x2) {
          local_8c = MBEDTLS_ECP_DP_SECP384R1;
        }
        else {
          if (puVar1 != (uint8_t *)0x3) {
            if (perr == (cose_errback *)0x0) {
              return false;
            }
            perr->err = COSE_ERR_INVALID_PARAMETER;
            return false;
          }
          local_8c = MBEDTLS_ECP_DP_SECP521R1;
        }
        iVar2 = mbedtls_ecp_group_load(&eckey->grp,local_8c);
        if (iVar2 == 0) {
          iVar2 = (int)((eckey->grp).nbits + 7 >> 3);
          pcVar3 = cn_cbor_mapget_int(pKey,-2);
          if ((pcVar3 == (cn_cbor *)0x0) || (pcVar3->type != CN_CBOR_BYTES)) {
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_INVALID_PARAMETER;
            }
          }
          else if (pcVar3->length == iVar2) {
            memcpy((void *)((long)&cbGroup + 1),(pcVar3->v).bytes,(long)pcVar3->length);
            pcVar3 = cn_cbor_mapget_int(pKey,-3);
            if (pcVar3 == (cn_cbor *)0x0) {
              if (perr != (cose_errback *)0x0) {
                perr->err = COSE_ERR_INVALID_PARAMETER;
              }
            }
            else {
              if (pcVar3->type == CN_CBOR_BYTES) {
                cbGroup._0_1_ = 4;
                if (pcVar3->length != iVar2) {
                  if (perr == (cose_errback *)0x0) {
                    return false;
                  }
                  perr->err = COSE_ERR_INVALID_PARAMETER;
                  return false;
                }
                memcpy((void *)((long)&cbGroup + (long)pcVar3->length + 1),(pcVar3->v).bytes,
                       (long)pcVar3->length);
                iVar2 = iVar2 * 2;
              }
              else if (pcVar3->type == CN_CBOR_TRUE) {
                cbGroup._0_1_ = 3;
              }
              else {
                if (pcVar3->type != CN_CBOR_FALSE) {
                  if (perr == (cose_errback *)0x0) {
                    return false;
                  }
                  perr->err = COSE_ERR_INVALID_PARAMETER;
                  return false;
                }
                cbGroup._0_1_ = 2;
              }
              p._4_4_ = iVar2 + 1;
              iVar2 = mbedtls_ecp_point_read_binary
                                (&eckey->grp,&eckey->Q,(uchar *)&cbGroup,(long)p._4_4_);
              if (iVar2 == 0) {
                pcVar3 = cn_cbor_mapget_int(pKey,-4);
                if (pcVar3 == (cn_cbor *)0x0) {
                  return true;
                }
                if (pcVar3->type == CN_CBOR_BYTES) {
                  iVar2 = mbedtls_mpi_read_binary(&eckey->d,(pcVar3->v).bytes,(long)pcVar3->length);
                  if (iVar2 == 0) {
                    return true;
                  }
                  if (perr != (cose_errback *)0x0) {
                    perr->err = COSE_ERR_CRYPTO_FAIL;
                  }
                }
                else if (perr != (cose_errback *)0x0) {
                  perr->err = COSE_ERR_INVALID_PARAMETER;
                }
              }
              else if (perr != (cose_errback *)0x0) {
                perr->err = COSE_ERR_INVALID_PARAMETER;
              }
            }
          }
          else if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_INVALID_PARAMETER;
          }
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_INVALID_PARAMETER;
        }
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  return false;
}

Assistant:

bool eckey_from_cbor(eckey_t * eckey, const cn_cbor * pKey, cose_errback * perr)
{
	byte  rgbKey[MBEDTLS_ECP_MAX_PT_LEN];
	int cbKey;
	int cbGroup;
	const cn_cbor * p;
	mbedtls_ecp_group_id groupId;

	mbedtls_ecp_keypair_init(eckey);

	p = cn_cbor_mapget_int(pKey, COSE_Key_Type);
	CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
	if(p->type == CN_CBOR_UINT) {
		CHECK_CONDITION(p->v.uint == COSE_Key_Type_EC2, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Curve);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_UINT), COSE_ERR_INVALID_PARAMETER);

	switch (p->v.uint) {
	case 1: // P-256
		groupId = MBEDTLS_ECP_DP_SECP256R1;
		break;

	case 2: // P-384
		groupId = MBEDTLS_ECP_DP_SECP384R1;
		break;

	case 3: // P-521
		groupId = MBEDTLS_ECP_DP_SECP521R1;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	CHECK_CONDITION(mbedtls_ecp_group_load(&eckey->grp, groupId) == 0, COSE_ERR_INVALID_PARAMETER);
	cbGroup = (eckey->grp.nbits + 7) / 8;

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_X);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
	memcpy(rgbKey+1, p->v.str, p->length);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Y);
	CHECK_CONDITION((p != NULL), COSE_ERR_INVALID_PARAMETER);
	if (p->type == CN_CBOR_BYTES) {
		rgbKey[0] = 0x04;
		cbKey = cbGroup * 2 + 1;
		CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbKey + p->length + 1, p->v.str, p->length);
	}
	else if (p->type == CN_CBOR_TRUE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x03;
	}
	else if (p->type == CN_CBOR_FALSE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x02;
	}
	else FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_ecp_point_read_binary(&eckey->grp, &eckey->Q, rgbKey, cbKey) == 0, COSE_ERR_INVALID_PARAMETER);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_d);
	if (p != NULL) {
		CHECK_CONDITION(p->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(mbedtls_mpi_read_binary( &eckey->d, p->v.bytes, p->length) == 0, COSE_ERR_CRYPTO_FAIL);
	}
	return true;

errorReturn:
	return false;
}